

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_sqrt(secp256k1_fe *a,secp256k1_fe *k)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint64_t uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  long lVar53;
  uint uVar54;
  int iVar55;
  ulong uVar56;
  long extraout_RDX;
  ulong uVar57;
  ulong uVar58;
  uint64_t *t;
  long lVar59;
  secp256k1_gej *psVar60;
  secp256k1_gej *a_00;
  secp256k1_fe *psVar61;
  secp256k1_fe *psVar62;
  secp256k1_fe *psVar63;
  secp256k1_ge *psVar64;
  secp256k1_gej *b;
  secp256k1_gej *__src;
  secp256k1_gej *psVar65;
  ulong uVar66;
  ulong uVar67;
  secp256k1_ge *psVar68;
  secp256k1_ge *r;
  int *piVar69;
  uint64_t uVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  secp256k1_fe sStack_428;
  secp256k1_fe *psStack_3f8;
  secp256k1_fe sStack_3e8;
  secp256k1_fe sStack_3b8;
  secp256k1_fe sStack_388;
  secp256k1_fe sStack_350;
  secp256k1_fe sStack_320;
  secp256k1_fe sStack_2f0;
  secp256k1_gej *psStack_2b8;
  secp256k1_gej *psStack_2b0;
  secp256k1_fe *psStack_2a8;
  undefined1 *puStack_2a0;
  secp256k1_fe *psStack_298;
  secp256k1_fe *psStack_290;
  secp256k1_gej sStack_288;
  secp256k1_ge *psStack_1e8;
  int *piStack_1e0;
  secp256k1_gej *psStack_1d8;
  secp256k1_ge *psStack_1d0;
  code *pcStack_1c8;
  long lStack_1c0;
  secp256k1_fe sStack_1b8;
  secp256k1_ge *psStack_188;
  secp256k1_fe sStack_128;
  secp256k1_fe sStack_f8;
  secp256k1_fe *psStack_c8;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  uint64_t local_38;
  uint64_t uStack_30;
  uint64_t local_28;
  uint64_t uStack_20;
  
  psVar61 = &local_98;
  psVar62 = &local_98;
  psVar63 = &local_98;
  uVar54 = secp256k1_fe_sqrt(&local_98,a);
  if (uVar54 == (k == (secp256k1_fe *)0x0)) {
    test_sqrt_cold_7();
LAB_001576c1:
    test_sqrt_cold_6();
LAB_001576c6:
    test_sqrt_cold_5();
LAB_001576cb:
    psVar63 = psVar61;
    test_sqrt_cold_4();
LAB_001576d0:
    test_sqrt_cold_3();
LAB_001576d5:
    test_sqrt_cold_2();
  }
  else {
    if (k == (secp256k1_fe *)0x0) {
      return;
    }
    secp256k1_fe_verify(&local_98);
    psVar61 = psVar62;
    if (1 < local_98.magnitude) goto LAB_001576c1;
    local_68.n[0] = 0x3ffffbfffff0bc - local_98.n[0];
    local_68.n[1] = 0x3ffffffffffffc - local_98.n[1];
    local_68.n[2] = 0x3ffffffffffffc - local_98.n[2];
    local_68.n[3] = 0x3ffffffffffffc - local_98.n[3];
    uVar70 = 0x3fffffffffffc - local_98.n[4];
    local_68.magnitude = 2;
    local_68.normalized = 0;
    local_68.n[4] = uVar70;
    local_38 = local_68.n[2];
    uStack_30 = local_68.n[3];
    local_28 = local_68.n[0];
    uStack_20 = local_68.n[1];
    secp256k1_fe_verify(&local_68);
    secp256k1_fe_verify(&local_98);
    psVar61 = k;
    secp256k1_fe_verify(k);
    iVar55 = k->magnitude + local_98.magnitude;
    if (0x20 < iVar55) goto LAB_001576c6;
    local_98.n[0] = k->n[0] + local_98.n[0];
    local_98.n[1] = k->n[1] + local_98.n[1];
    local_98.n[2] = k->n[2] + local_98.n[2];
    local_98.n[3] = k->n[3] + local_98.n[3];
    local_98.n[4] = local_98.n[4] + k->n[4];
    local_98.normalized = 0;
    local_98.magnitude = iVar55;
    secp256k1_fe_verify(&local_98);
    secp256k1_fe_verify(&local_68);
    psVar61 = k;
    secp256k1_fe_verify(k);
    if (0x1e < k->magnitude) goto LAB_001576cb;
    local_68.n[0] = k->n[0] + local_28;
    local_68.n[1] = k->n[1] + uStack_20;
    local_68.n[2] = k->n[2] + local_38;
    local_68.n[3] = k->n[3] + uStack_30;
    local_68.n[4] = uVar70 + k->n[4];
    local_68.normalized = 0;
    local_68.magnitude = k->magnitude + 2;
    secp256k1_fe_verify(&local_68);
    secp256k1_fe_normalize(&local_98);
    secp256k1_fe_normalize(&local_68);
    secp256k1_fe_verify(&local_98);
    k = &local_98;
    if (local_98.normalized == 0) goto LAB_001576d0;
    auVar72._8_8_ = local_98.n[1];
    auVar72._0_8_ = local_98.n[0];
    auVar45._8_8_ = local_98.n[3];
    auVar45._0_8_ = local_98.n[2];
    if ((SUB168(auVar72 | auVar45,8) == 0 && SUB168(auVar72 | auVar45,0) == 0) && local_98.n[4] == 0
       ) {
      return;
    }
    k = &local_68;
    psVar63 = k;
    secp256k1_fe_verify(k);
    if (local_68.normalized == 0) goto LAB_001576d5;
    auVar50._8_8_ = local_68.n[1];
    auVar50._0_8_ = local_68.n[0];
    auVar51._8_8_ = local_68.n[3];
    auVar51._0_8_ = local_68.n[2];
    if ((SUB168(auVar50 | auVar51,8) == 0 && SUB168(auVar50 | auVar51,0) == 0) && local_68.n[4] == 0
       ) {
      return;
    }
  }
  test_sqrt_cold_1();
  psVar64 = (secp256k1_ge *)(psVar63 + 2);
  psVar60 = (secp256k1_gej *)a;
  psStack_c8 = k;
  random_fe_non_zero_test((secp256k1_fe *)psVar64);
  psVar68 = psVar64;
  secp256k1_fe_verify((secp256k1_fe *)psVar64);
  if (psVar63[2].magnitude < 9) {
    uVar58 = (psVar64->x).n[0];
    uVar67 = psVar63[2].n[1];
    uVar2 = psVar63[2].n[2];
    uVar3 = psVar63[2].n[3];
    uVar4 = psVar63[2].n[4];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar58 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar3;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar67 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar4;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar4;
    uVar56 = SUB168(auVar7 * auVar27,0);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar56 & 0xfffffffffffff;
    auVar72 = auVar6 * auVar26 + auVar5 * auVar25 + auVar8 * ZEXT816(0x1000003d10);
    uVar57 = auVar72._0_8_;
    sStack_128.n[0] = uVar57 & 0xfffffffffffff;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar57 >> 0x34 | auVar72._8_8_ << 0xc;
    uVar4 = uVar4 * 2;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar58;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar4;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar67 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar3;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar2;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar2;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar56 >> 0x34 | SUB168(auVar7 * auVar27,8) << 0xc;
    auVar72 = auVar9 * auVar28 + auVar41 + auVar10 * auVar29 + auVar11 * auVar30 +
              auVar12 * ZEXT816(0x1000003d10);
    uVar56 = auVar72._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar56 >> 0x34 | auVar72._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar58;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar58;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar67;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar4;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar2 * 2;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar3;
    auVar72 = auVar14 * auVar32 + auVar42 + auVar15 * auVar33;
    uVar57 = auVar72._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar57 >> 0x34 | auVar72._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (uVar57 & 0xfffffffffffff) << 4 | (uVar56 & 0xfffffffffffff) >> 0x30;
    auVar72 = auVar13 * auVar31 + ZEXT816(0x1000003d1) * auVar34;
    uVar57 = auVar72._0_8_;
    sStack_f8.n[0] = uVar57 & 0xfffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar57 >> 0x34 | auVar72._8_8_ << 0xc;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar58 * 2;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar67;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar4;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar3;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar3;
    auVar45 = auVar17 * auVar36 + auVar44 + auVar18 * auVar37;
    uVar57 = auVar45._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar57 & 0xfffffffffffff;
    auVar72 = auVar16 * auVar35 + auVar43 + auVar19 * ZEXT816(0x1000003d10);
    uVar66 = auVar72._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar57 >> 0x34 | auVar45._8_8_ << 0xc;
    sStack_f8.n[1] = uVar66 & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar66 >> 0x34 | auVar72._8_8_ << 0xc;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar58 * 2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar2;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar67;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar67;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar3;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar4;
    auVar47 = auVar22 * auVar40 + auVar47;
    uVar58 = auVar47._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar58 & 0xfffffffffffff;
    auVar72 = auVar20 * auVar38 + auVar46 + auVar21 * auVar39 + auVar23 * ZEXT816(0x1000003d10);
    uVar67 = auVar72._0_8_;
    sStack_f8.n[2] = uVar67 & 0xfffffffffffff;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = (uVar67 >> 0x34 | auVar72._8_8_ << 0xc) + sStack_128.n[0];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar58 >> 0x34 | auVar47._8_8_ << 0xc;
    auVar48 = auVar24 * ZEXT816(0x1000003d10) + auVar48;
    uVar58 = auVar48._0_8_;
    sStack_f8.n[3] = uVar58 & 0xfffffffffffff;
    sStack_f8.n[4] = (uVar58 >> 0x34 | auVar48._8_8_ << 0xc) + (uVar56 & 0xffffffffffff);
    sStack_f8.magnitude = 1;
    sStack_f8.normalized = 0;
    secp256k1_fe_verify(&sStack_f8);
    secp256k1_fe_mul(&sStack_128,&sStack_f8,(secp256k1_fe *)psVar64);
    secp256k1_fe_mul(psVar63,a,&sStack_f8);
    secp256k1_fe_mul(psVar63 + 1,&((secp256k1_gej *)a)->y,&sStack_128);
    *(int *)psVar63[3].n = (int)(((secp256k1_gej *)a)->z).n[0];
    return;
  }
  random_group_element_jacobian_test_cold_1();
  while( true ) {
    random_fe_test(&psVar68->x);
    psVar64 = psVar68;
    secp256k1_fe_verify(&psVar68->x);
    if ((psVar68->x).normalized == 0) break;
    auVar72 = *(undefined1 (*) [16])((psVar68->x).n + 2) | *(undefined1 (*) [16])(psVar68->x).n;
    if ((auVar72._8_8_ != 0 || auVar72._0_8_ != 0) || (psVar68->x).n[4] != 0) {
      return;
    }
  }
  random_fe_non_zero_test_cold_1();
  if (extraout_RDX == 0) {
    return;
  }
  psVar61 = &psVar60->z;
  lStack_1c0 = -1;
  lVar59 = 0;
  r = psVar64;
  psStack_188 = psVar68;
  do {
    pcStack_1c8 = (code *)0x157a38;
    secp256k1_gej_verify((secp256k1_gej *)(psVar61 + -2));
    if ((int)psVar61[1].n[0] == 0) {
      if (lStack_1c0 == -1) {
        uVar70 = psVar61->n[0];
        uVar49 = psVar61->n[1];
        auVar72 = *(undefined1 (*) [16])(psVar61->n + 2);
        iVar55 = psVar61->magnitude;
        iVar52 = psVar61->normalized;
        (r->x).n[4] = psVar61->n[4];
        (r->x).magnitude = iVar55;
        (r->x).normalized = iVar52;
        *(undefined1 (*) [16])((r->x).n + 2) = auVar72;
        (r->x).n[0] = uVar70;
        (r->x).n[1] = uVar49;
        lStack_1c0 = lVar59;
      }
      else {
        pcStack_1c8 = (code *)0x157a66;
        secp256k1_fe_mul(&r->x,&psVar64[lStack_1c0].x,psVar61);
        lStack_1c0 = lVar59;
      }
    }
    else {
      pcStack_1c8 = (code *)0x157a48;
      secp256k1_ge_set_infinity(r);
    }
    lVar53 = lStack_1c0;
    lVar59 = lVar59 + 1;
    r = r + 1;
    psVar61 = (secp256k1_fe *)(psVar61[3].n + 1);
  } while (extraout_RDX != lVar59);
  if (lStack_1c0 == -1) {
    return;
  }
  psVar68 = (secp256k1_ge *)(lStack_1c0 * 0x68);
  a_00 = (secp256k1_gej *)(psVar64 + lStack_1c0);
  b = (secp256k1_gej *)&sStack_1b8;
  pcStack_1c8 = (code *)0x157abf;
  secp256k1_fe_inv_var((secp256k1_fe *)b,(secp256k1_fe *)a_00);
  if (lVar53 == 0) {
    lStack_1c0 = 0;
    piVar69 = (int *)0x0;
  }
  else {
    lVar59 = lVar53 + -1;
    piVar69 = &psVar60[lVar53 + -1].infinity;
    psVar68 = psVar64 + -1 + lVar53;
    do {
      if (*piVar69 == 0) {
        pcStack_1c8 = (code *)0x157b01;
        secp256k1_fe_mul(&psVar64[lStack_1c0].x,&psVar68->x,&sStack_1b8);
        a_00 = (secp256k1_gej *)&sStack_1b8;
        pcStack_1c8 = (code *)0x157b1e;
        b = a_00;
        secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_00,&psVar60[lStack_1c0].z);
        lStack_1c0 = lVar59;
      }
      piVar69 = piVar69 + -0x26;
      psVar68 = psVar68 + -1;
      bVar71 = lVar59 != 0;
      lVar59 = lVar59 + -1;
    } while (bVar71);
  }
  if (psVar60[lStack_1c0].infinity == 0) {
    puVar1 = psVar64[lStack_1c0].x.n + 4;
    *puVar1 = sStack_1b8.n[4];
    puVar1[1] = sStack_1b8._40_8_;
    puVar1 = psVar64[lStack_1c0].x.n + 2;
    *puVar1 = sStack_1b8.n[2];
    puVar1[1] = sStack_1b8.n[3];
    psVar64[lStack_1c0].x.n[0] = sStack_1b8.n[0];
    psVar64[lStack_1c0].x.n[1] = sStack_1b8.n[1];
    for (lVar59 = extraout_RDX; lVar59 != 0; lVar59 = lVar59 + -1) {
      if (psVar60->infinity == 0) {
        pcStack_1c8 = (code *)0x157b94;
        secp256k1_ge_set_gej_zinv(psVar64,psVar60,&psVar64->x);
      }
      pcStack_1c8 = (code *)0x157b9c;
      secp256k1_ge_verify(psVar64);
      psVar64 = psVar64 + 1;
      psVar60 = psVar60 + 1;
    }
    return;
  }
  pcStack_1c8 = test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src = &sStack_288;
  psVar65 = &sStack_288;
  psStack_290 = (secp256k1_fe *)0x157bea;
  psStack_1e8 = psVar68;
  piStack_1e0 = piVar69;
  psStack_1d8 = psVar60;
  psStack_1d0 = psVar64;
  pcStack_1c8 = (code *)lVar59;
  memcpy(&sStack_288,b,0x98);
  psStack_290 = (secp256k1_fe *)0x157bf2;
  secp256k1_gej_verify(&sStack_288);
  psStack_290 = (secp256k1_fe *)0x157bfa;
  secp256k1_gej_verify(a_00);
  psStack_290 = (secp256k1_fe *)0x157c07;
  secp256k1_fe_cmov(&sStack_288.x,&a_00->x,0);
  psVar61 = &a_00->y;
  psStack_290 = (secp256k1_fe *)0x157c1a;
  secp256k1_fe_cmov(&sStack_288.y,psVar61,0);
  psVar62 = &sStack_288.z;
  psVar63 = &a_00->z;
  psStack_290 = (secp256k1_fe *)0x157c30;
  secp256k1_fe_cmov(psVar62,psVar63,0);
  psStack_290 = (secp256k1_fe *)0x157c38;
  secp256k1_gej_verify(&sStack_288);
  psStack_290 = (secp256k1_fe *)0x157c43;
  psVar60 = b;
  iVar55 = gej_xyz_equals_gej(&sStack_288,b);
  if (iVar55 == 0) {
    psStack_290 = (secp256k1_fe *)0x157cda;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_290 = (secp256k1_fe *)0x157c56;
    secp256k1_gej_verify(&sStack_288);
    psStack_290 = (secp256k1_fe *)0x157c5e;
    secp256k1_gej_verify(a_00);
    psStack_290 = (secp256k1_fe *)0x157c6e;
    secp256k1_fe_cmov(&sStack_288.x,&a_00->x,1);
    psStack_290 = (secp256k1_fe *)0x157c80;
    secp256k1_fe_cmov(&sStack_288.y,psVar61,1);
    psStack_290 = (secp256k1_fe *)0x157c90;
    secp256k1_fe_cmov(psVar62,psVar63,1);
    sStack_288.infinity = sStack_288.infinity & 0xfffffffeU | a_00->infinity & 1U;
    psStack_290 = (secp256k1_fe *)0x157cb4;
    secp256k1_gej_verify(&sStack_288);
    psStack_290 = (secp256k1_fe *)0x157cbf;
    psVar60 = a_00;
    iVar55 = gej_xyz_equals_gej(&sStack_288,a_00);
    __src = psVar65;
    if (iVar55 != 0) {
      return;
    }
  }
  psStack_290 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_290 = psVar63;
  psStack_298 = psVar61;
  puStack_2a0 = (undefined1 *)&sStack_288;
  psStack_2a8 = psVar62;
  psStack_2b0 = b;
  psStack_2b8 = a_00;
  if ((*(int *)((long)__src + 0x90) != psVar60->infinity) || (*(int *)((long)__src + 0x90) != 0)) {
    return;
  }
  psStack_3f8 = (secp256k1_fe *)0x157d2c;
  memcpy(&sStack_350,__src,0x98);
  psVar61 = &sStack_3e8;
  psStack_3f8 = (secp256k1_fe *)0x157d41;
  memcpy(psVar61,psVar60,0x98);
  psStack_3f8 = (secp256k1_fe *)0x157d49;
  secp256k1_fe_normalize(&sStack_350);
  psStack_3f8 = (secp256k1_fe *)0x157d59;
  secp256k1_fe_normalize(&sStack_320);
  psStack_3f8 = (secp256k1_fe *)0x157d69;
  secp256k1_fe_normalize(&sStack_2f0);
  psStack_3f8 = (secp256k1_fe *)0x157d71;
  secp256k1_fe_normalize(psVar61);
  psVar63 = &sStack_3b8;
  psStack_3f8 = (secp256k1_fe *)0x157d7e;
  secp256k1_fe_normalize(psVar63);
  psVar62 = &sStack_388;
  psStack_3f8 = (secp256k1_fe *)0x157d8b;
  secp256k1_fe_normalize(psVar62);
  psStack_3f8 = (secp256k1_fe *)0x157d93;
  secp256k1_fe_verify(&sStack_350);
  psStack_3f8 = (secp256k1_fe *)0x157d9b;
  secp256k1_fe_verify(psVar61);
  if (sStack_350.normalized == 0) {
    psStack_3f8 = (secp256k1_fe *)0x157ea0;
    gej_xyz_equals_gej_cold_6();
LAB_00157ea0:
    psVar63 = psVar61;
    psStack_3f8 = (secp256k1_fe *)0x157ea5;
    gej_xyz_equals_gej_cold_5();
LAB_00157ea5:
    psStack_3f8 = (secp256k1_fe *)0x157eaa;
    gej_xyz_equals_gej_cold_4();
LAB_00157eaa:
    psVar62 = psVar63;
    psStack_3f8 = (secp256k1_fe *)0x157eaf;
    gej_xyz_equals_gej_cold_3();
  }
  else {
    if (sStack_3e8.normalized == 0) goto LAB_00157ea0;
    uVar54 = 4;
    do {
      uVar58 = sStack_3e8.n[uVar54];
      uVar67 = sStack_350.n[uVar54];
      if ((uVar67 >= uVar58 && uVar67 != uVar58) || (uVar67 < uVar58)) break;
      bVar71 = uVar54 != 0;
      uVar54 = uVar54 - 1;
    } while (bVar71);
    psStack_3f8 = (secp256k1_fe *)0x157de5;
    secp256k1_fe_verify(&sStack_320);
    psStack_3f8 = (secp256k1_fe *)0x157ded;
    secp256k1_fe_verify(psVar63);
    if (sStack_320.normalized == 0) goto LAB_00157ea5;
    if (sStack_3b8.normalized == 0) goto LAB_00157eaa;
    uVar54 = 4;
    do {
      uVar58 = sStack_3b8.n[uVar54];
      uVar67 = sStack_320.n[uVar54];
      if ((uVar67 >= uVar58 && uVar67 != uVar58) || (uVar67 < uVar58)) break;
      bVar71 = uVar54 != 0;
      uVar54 = uVar54 - 1;
    } while (bVar71);
    psStack_3f8 = (secp256k1_fe *)0x157e3e;
    secp256k1_fe_verify(&sStack_2f0);
    psStack_3f8 = (secp256k1_fe *)0x157e46;
    secp256k1_fe_verify(psVar62);
    if (sStack_2f0.normalized != 0) {
      if (sStack_388.normalized != 0) {
        uVar54 = 4;
        do {
          if (sStack_2f0.n[uVar54] != sStack_388.n[uVar54]) {
            return;
          }
          bVar71 = uVar54 != 0;
          uVar54 = uVar54 - 1;
        } while (bVar71);
        return;
      }
      goto LAB_00157eb4;
    }
  }
  psStack_3f8 = (secp256k1_fe *)0x157eb4;
  gej_xyz_equals_gej_cold_2();
LAB_00157eb4:
  psStack_3f8 = (secp256k1_fe *)secp256k1_gej_has_quad_y_var;
  gej_xyz_equals_gej_cold_1();
  if ((int)psVar62[3].n[0] == 0) {
    psStack_3f8 = &sStack_2f0;
    secp256k1_fe_mul(&sStack_428,psVar62 + 1,psVar62 + 2);
    secp256k1_fe_is_square_var(&sStack_428);
    return;
  }
  return;
}

Assistant:

static void test_sqrt(const secp256k1_fe *a, const secp256k1_fe *k) {
    secp256k1_fe r1, r2;
    int v = secp256k1_fe_sqrt(&r1, a);
    CHECK((v == 0) == (k == NULL));

    if (k != NULL) {
        /* Check that the returned root is +/- the given known answer */
        secp256k1_fe_negate(&r2, &r1, 1);
        secp256k1_fe_add(&r1, k); secp256k1_fe_add(&r2, k);
        secp256k1_fe_normalize(&r1); secp256k1_fe_normalize(&r2);
        CHECK(secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2));
    }
}